

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O3

uint8_t duckdb::GetCandidateSpecificity(LogicalType *candidate_type)

{
  LogicalTypeId LVar1;
  uint8_t uVar2;
  _Hash_node_base *p_Var3;
  BinderException *this;
  __hash_code __code;
  ulong uVar4;
  unordered_map<unsigned_char,_unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
  auto_type_candidates_specificity;
  undefined1 local_9b;
  undefined1 local_9a;
  undefined1 local_99;
  string local_98;
  string local_78;
  _Hashtable<unsigned_char,_std::pair<const_unsigned_char,_unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_58;
  
  local_98.field_2._4_8_ = 0xd010c0a0b100a0f;
  local_98._M_dataplus._M_p = (pointer)0x315021601170019;
  local_98._M_string_length._0_4_ = 0x50d040e;
  local_98._12_8_ = 0x9130820070b060c;
  ::std::
  _Hashtable<unsigned_char,std::pair<unsigned_char_const,unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_char>>,std::__detail::_Select1st,std::equal_to<unsigned_char>,std::hash<unsigned_char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<unsigned_char_const,unsigned_char>const*>
            ((_Hashtable<unsigned_char,std::pair<unsigned_char_const,unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_char>>,std::__detail::_Select1st,std::equal_to<unsigned_char>,std::hash<unsigned_char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_58,&local_98,(undefined1 *)((long)&local_98.field_2 + 0xc),0,&local_99,
             &local_9a,&local_9b);
  uVar4 = (ulong)candidate_type->id_ % local_58._M_bucket_count;
  if (local_58._M_buckets[uVar4 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var3 = local_58._M_buckets[uVar4 & 0xffffffff]->_M_nxt;
    LVar1 = *(LogicalTypeId *)&p_Var3[1]._M_nxt;
    do {
      if (candidate_type->id_ == LVar1) {
        uVar2 = *(uint8_t *)((long)&p_Var3[1]._M_nxt + 1);
        ::std::
        _Hashtable<unsigned_char,_std::pair<const_unsigned_char,_unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_58);
        return uVar2;
      }
      p_Var3 = p_Var3->_M_nxt;
    } while ((p_Var3 != (_Hash_node_base *)0x0) &&
            (LVar1 = *(LogicalTypeId *)&p_Var3[1]._M_nxt,
            (ulong)LVar1 % local_58._M_bucket_count == uVar4));
  }
  this = (BinderException *)__cxa_allocate_exception(0x10);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"Auto Type Candidate of type %s is not accepted as a valid input",
             "");
  EnumUtil::ToString<duckdb::LogicalTypeId>(&local_78,candidate_type->id_);
  BinderException::BinderException<std::__cxx11::string>(this,&local_98,&local_78);
  __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static uint8_t GetCandidateSpecificity(const LogicalType &candidate_type) {
	//! Const ht with accepted auto_types and their weights in specificity
	const duckdb::unordered_map<uint8_t, uint8_t> auto_type_candidates_specificity {
	    {static_cast<uint8_t>(LogicalTypeId::VARCHAR), 0},      {static_cast<uint8_t>(LogicalTypeId::DOUBLE), 1},
	    {static_cast<uint8_t>(LogicalTypeId::FLOAT), 2},        {static_cast<uint8_t>(LogicalTypeId::DECIMAL), 3},
	    {static_cast<uint8_t>(LogicalTypeId::BIGINT), 4},       {static_cast<uint8_t>(LogicalTypeId::INTEGER), 5},
	    {static_cast<uint8_t>(LogicalTypeId::SMALLINT), 6},     {static_cast<uint8_t>(LogicalTypeId::TINYINT), 7},
	    {static_cast<uint8_t>(LogicalTypeId::TIMESTAMP_TZ), 8}, {static_cast<uint8_t>(LogicalTypeId::TIMESTAMP), 9},
	    {static_cast<uint8_t>(LogicalTypeId::DATE), 10},        {static_cast<uint8_t>(LogicalTypeId::TIME), 11},
	    {static_cast<uint8_t>(LogicalTypeId::BOOLEAN), 12},     {static_cast<uint8_t>(LogicalTypeId::SQLNULL), 13}};

	auto id = static_cast<uint8_t>(candidate_type.id());
	auto it = auto_type_candidates_specificity.find(id);
	if (it == auto_type_candidates_specificity.end()) {
		throw BinderException("Auto Type Candidate of type %s is not accepted as a valid input",
		                      EnumUtil::ToString(candidate_type.id()));
	}
	return it->second;
}